

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simSymSim.c
# Opt level: O0

void Sim_SymmsSimulate(Sym_Man_t *p,uint *pPat,Vec_Ptr_t *vMatrsNonSym)

{
  int iVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  Abc_Obj_t *pAVar5;
  abctime aVar6;
  abctime clk;
  int nPairsNonSym;
  int nPairsSym;
  int nPairsTotal;
  int i;
  Abc_Obj_t *pNode;
  Vec_Ptr_t *vMatrsNonSym_local;
  uint *pPat_local;
  Sym_Man_t *p_local;
  
  Sim_SymmsCreateSquare(p,pPat);
  aVar4 = Abc_Clock();
  for (nPairsSym = 0; iVar1 = Vec_PtrSize(p->vNodes), nPairsSym < iVar1; nPairsSym = nPairsSym + 1)
  {
    pAVar5 = (Abc_Obj_t *)Vec_PtrEntry(p->vNodes,nPairsSym);
    Sim_UtilSimulateNodeOne(pAVar5,p->vSim,p->nSimWords,0);
  }
  aVar6 = Abc_Clock();
  p->timeSim = (aVar6 - aVar4) + p->timeSim;
  aVar4 = Abc_Clock();
  nPairsSym = 0;
  while( true ) {
    iVar1 = Abc_NtkCoNum(p->pNtk);
    if (iVar1 <= nPairsSym) {
      aVar6 = Abc_Clock();
      p->timeMatr = (aVar6 - aVar4) + p->timeMatr;
      return;
    }
    pAVar5 = Abc_NtkCo(p->pNtk,nPairsSym);
    pAVar5 = Abc_ObjFanin0(pAVar5);
    iVar1 = Vec_IntEntry(p->vPairsTotal,nPairsSym);
    iVar2 = Vec_IntEntry(p->vPairsSym,nPairsSym);
    iVar3 = Vec_IntEntry(p->vPairsNonSym,nPairsSym);
    if (iVar1 < iVar2 + iVar3) break;
    if (iVar1 != iVar2 + iVar3) {
      Sim_SymmsDeriveInfo(p,pPat,pAVar5,vMatrsNonSym,nPairsSym);
    }
    nPairsSym = nPairsSym + 1;
  }
  __assert_fail("nPairsTotal >= nPairsSym + nPairsNonSym",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sim/simSymSim.c"
                ,0x4c,"void Sim_SymmsSimulate(Sym_Man_t *, unsigned int *, Vec_Ptr_t *)");
}

Assistant:

void Sim_SymmsSimulate( Sym_Man_t * p, unsigned * pPat, Vec_Ptr_t * vMatrsNonSym )
{
    Abc_Obj_t * pNode;
    int i, nPairsTotal, nPairsSym, nPairsNonSym;
    abctime clk;

    // create the simulation matrix
    Sim_SymmsCreateSquare( p, pPat );
    // simulate each node in the DFS order
clk = Abc_Clock();
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vNodes, pNode, i )
    {
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        Sim_UtilSimulateNodeOne( pNode, p->vSim, p->nSimWords, 0 );
    }
p->timeSim += Abc_Clock() - clk;
    // collect info into the CO matrices
clk = Abc_Clock();
    Abc_NtkForEachCo( p->pNtk, pNode, i )
    {
        pNode = Abc_ObjFanin0(pNode);
//        if ( Abc_ObjIsCi(pNode) || Abc_AigNodeIsConst(pNode) )
//            continue;
        nPairsTotal  = Vec_IntEntry(p->vPairsTotal, i);
        nPairsSym    = Vec_IntEntry(p->vPairsSym,   i);
        nPairsNonSym = Vec_IntEntry(p->vPairsNonSym,i);
        assert( nPairsTotal >= nPairsSym + nPairsNonSym ); 
        if ( nPairsTotal == nPairsSym + nPairsNonSym )
            continue;
        Sim_SymmsDeriveInfo( p, pPat, pNode, vMatrsNonSym, i );
    }
p->timeMatr += Abc_Clock() - clk;
}